

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

bool __thiscall
iqnet::Reactor<iqnet::Null_lock>::handle_system_events(Reactor<iqnet::Null_lock> *this,Timeout ms)

{
  pollfd pVar1;
  _List_node_base *p_Var2;
  pollfd pVar3;
  byte bVar4;
  int iVar5;
  int in_ECX;
  _Node *__tmp;
  HandlerState hs;
  HandlerStateList ret;
  HandlerStateList tmp;
  HandlerState local_68;
  pollfd local_60;
  pollfd local_58;
  long local_50;
  HandlerStateList local_48;
  
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)&local_48,&this->handlers_states);
  if (local_48.
      super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_48) {
    bVar4 = 1;
  }
  else {
    Reactor_poll_impl::reset(&this->impl,&local_48);
    local_50 = 0;
    local_60 = (pollfd)&local_60;
    local_58 = (pollfd)&local_60;
    iVar5 = Reactor_poll_impl::poll(&this->impl,&local_60,(ulong)(uint)ms,in_ECX);
    bVar4 = (byte)iVar5;
    pVar3 = local_60;
    if ((local_60 != (pollfd)&local_60 & bVar4) == 1) {
      do {
        pVar3 = local_60;
        local_68 = *(HandlerState *)((long)local_60 + 0x10);
        local_50 = local_50 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete((void *)pVar3,0x18);
        invoke_event_handler(this,&local_68);
        pVar3 = local_60;
      } while (local_60 != (pollfd)&local_60);
    }
    while (pVar3 != (pollfd)&local_60) {
      pVar1 = *(pollfd *)pVar3;
      operator_delete((void *)pVar3,0x18);
      pVar3 = pVar1;
    }
  }
  while (local_48.
         super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var2 = (((_List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                *)&(local_48.
                    super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                    ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_48.
                    super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x18);
    local_48.
    super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
  }
  return (bool)bVar4;
}

Assistant:

bool Reactor<Lock>::handle_system_events(Reactor_base::Timeout ms)
{
  scoped_lock lk(lock);
  HandlerStateList tmp(handlers_states);
  lk.unlock();

  // if all events were of "user" type
  if (tmp.empty())
    return true;

  impl.reset(tmp);
  HandlerStateList ret;
  bool succ = impl.poll(ret, ms);

  if (!succ)
    return false;

  while (!ret.empty())
  {
    HandlerState hs(ret.front());
    ret.pop_front();
    invoke_event_handler(hs);
  }

  return true;
}